

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

string * __thiscall soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,Function *f)

{
  char *in_RCX;
  string_view name;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [16];
  soul *local_18;
  Function *f_local;
  
  local_18 = this;
  f_local = (Function *)__return_storage_ptr__;
  getFullPathForASTObject<soul::AST::Function>(&local_68,(Function *)this);
  std::operator+(&local_48,"fn_",&local_68);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  name._M_len = local_28._8_8_;
  name._M_str = in_RCX;
  makeUID_abi_cxx11_(__return_storage_ptr__,local_28._0_8_,name);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeUID (AST::Function& f)               { return makeUID ("fn_" + getFullPathForASTObject (f)); }